

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bloaty.cc
# Opt level: O3

void __thiscall bloaty::Bloaty::AddFilename(Bloaty *this,string *filename,bool is_base)

{
  pointer pcVar1;
  pointer pcVar2;
  string build_id;
  undefined1 local_88 [32];
  _Alloc_hider local_68;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_58;
  undefined1 local_48 [24];
  _func_int *local_30 [2];
  
  GetObjectFile((Bloaty *)local_48,(string *)this);
  (*(*(_func_int ***)local_48._0_8_)[2])(local_48 + 8);
  pcVar1 = local_88 + 0x10;
  local_88._0_8_ = pcVar1;
  if (is_base) {
    pcVar2 = (filename->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_88,pcVar2,pcVar2 + filename->_M_string_length);
    local_68._M_p = (pointer)&local_58;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_68,local_48._8_8_,local_48._16_8_ + local_48._8_8_);
    std::vector<bloaty::Bloaty::InputFileInfo,_std::allocator<bloaty::Bloaty::InputFileInfo>_>::
    emplace_back<bloaty::Bloaty::InputFileInfo>(&this->base_files_,(InputFileInfo *)local_88);
  }
  else {
    pcVar2 = (filename->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_88,pcVar2,pcVar2 + filename->_M_string_length);
    local_68._M_p = (pointer)&local_58;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_68,local_48._8_8_,local_48._16_8_ + local_48._8_8_);
    std::vector<bloaty::Bloaty::InputFileInfo,_std::allocator<bloaty::Bloaty::InputFileInfo>_>::
    emplace_back<bloaty::Bloaty::InputFileInfo>(&this->input_files_,(InputFileInfo *)local_88);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_p != &local_58) {
    operator_delete(local_68._M_p,local_58._M_allocated_capacity + 1);
  }
  if ((pointer)local_88._0_8_ != pcVar1) {
    operator_delete((void *)local_88._0_8_,local_88._16_8_ + 1);
  }
  if ((_func_int **)local_48._8_8_ != local_30) {
    operator_delete((void *)local_48._8_8_,(ulong)(local_30[0] + 1));
  }
  if ((InputFileFactory *)local_48._0_8_ != (InputFileFactory *)0x0) {
    (*(*(_func_int ***)local_48._0_8_)[1])();
  }
  return;
}

Assistant:

void Bloaty::AddFilename(const std::string& filename, bool is_base) {
  auto object_file = GetObjectFile(filename);
  std::string build_id = object_file->GetBuildId();

  if (is_base) {
    base_files_.push_back({filename, build_id});
  } else {
    input_files_.push_back({filename, build_id});
  }
}